

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

bool __thiscall QTextEdit::event(QTextEdit *this,QEvent *e)

{
  ushort uVar1;
  long lVar2;
  QWidgetTextControl *pQVar3;
  bool bVar4;
  LayoutDirection LVar5;
  int iVar6;
  int iVar7;
  QPalette *pal;
  long lVar8;
  long lVar9;
  QTextEditPrivate *d;
  long in_FS_OFFSET;
  QRect QVar10;
  QContextMenuEvent ce;
  QPoint local_88;
  QPoint local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 < 0x52) {
    if (uVar1 - 0x18 < 2) {
      pQVar3 = *(QWidgetTextControl **)(lVar2 + 0x2f8);
      pal = QWidget::palette((QWidget *)this);
      QWidgetTextControl::setPalette(pQVar3,pal);
    }
    else if (uVar1 == 0x33) {
LAB_004a0308:
      pQVar3 = *(QWidgetTextControl **)(lVar2 + 0x2f8);
      LVar5 = QWidget::layoutDirection(*(QWidget **)(lVar2 + 8));
      if (LVar5 == RightToLeft) {
        iVar6 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar2 + 0x288));
        iVar7 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
        iVar6 = iVar6 - iVar7;
      }
      else {
        iVar6 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
      }
      iVar7 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x290));
      local_78._8_8_ = (undefined8)iVar7;
      local_78._0_8_ = (undefined1 *)(double)iVar6;
      QWidgetTextControl::processEvent(pQVar3,e,(QPointF *)local_78,*(QWidget **)(lVar2 + 0x2b0));
    }
  }
  else if (uVar1 == 0x52) {
    if (e[0x38] == (QEvent)0x1) {
      (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x60))();
      QVar10 = cursorRect(this);
      lVar9 = (long)QVar10.x2.m_i.m_i + (long)QVar10.x1.m_i.m_i;
      lVar8 = (QVar10._8_8_ >> 0x20) + (QVar10._0_8_ >> 0x20);
      local_80 = (QPoint)((ulong)(lVar9 - (lVar9 >> 0x3f)) >> 1 & 0xffffffff |
                         (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = QWidget::mapToGlobal(*(QWidget **)(lVar2 + 0x2b0),&local_80);
      QContextMenuEvent::QContextMenuEvent((QContextMenuEvent *)local_78,1,&local_80,&local_88,0);
      local_78[0xc] = e[0xc];
      bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,(QEvent *)local_78);
      (**(code **)(*(long *)e + 0x10))(e,local_78[0xc]);
      QContextMenuEvent::~QContextMenuEvent((QContextMenuEvent *)local_78);
      goto LAB_004a0473;
    }
  }
  else if (uVar1 == 0x6e) goto LAB_004a0308;
  bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,e);
LAB_004a0473:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QTextEdit::event(QEvent *e)
{
    Q_D(QTextEdit);
    switch (e->type()) {
    case QEvent::ShortcutOverride:
    case QEvent::ToolTip:
        d->sendControlEvent(e);
        break;
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->control->setPalette(palette());
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard) {
            ensureCursorVisible();
            const QPoint cursorPos = cursorRect().center();
            QContextMenuEvent ce(QContextMenuEvent::Keyboard, cursorPos, d->viewport->mapToGlobal(cursorPos));
            ce.setAccepted(e->isAccepted());
            const bool result = QAbstractScrollArea::event(&ce);
            e->setAccepted(ce.isAccepted());
            return result;
        }
        break;
#endif // QT_NO_CONTEXTMENU
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled())
            d->sendControlEvent(e);
        break;
#endif
    default:
        break;
    }
    return QAbstractScrollArea::event(e);
}